

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# window.cpp
# Opt level: O0

WindowHandle create_window(string *title,int x,int y,int w,int h)

{
  WindowHandleData *this;
  undefined1 local_30 [16];
  WindowHandle handle;
  int h_local;
  int w_local;
  int y_local;
  int x_local;
  string *title_local;
  
  handle._0_4_ = h;
  handle._4_4_ = w;
  h_local = y;
  w_local = x;
  _y_local = title;
  if (((anonymous_namespace)::XThreads_initialized & 1) == 0) {
    XInitThreads();
    (anonymous_namespace)::XThreads_initialized = 1;
  }
  this = (WindowHandleData *)operator_new(0xd8);
  memset(this,0,0xd8);
  WindowHandleData::WindowHandleData(this);
  this->display = (Display *)0x0;
  this->im = (XImage *)0x0;
  this->pix_w = 0;
  this->pix_h = 0;
  this->data = (char *)0x0;
  this->bytes = (uint32_t *)0x0;
  this->listener = (IWindowListener *)0x0;
  this->w = 0;
  this->h = 0;
  this->x = w_local;
  this->y = h_local;
  this->channels = 0;
  local_30._8_8_ = this;
  anon_unknown.dwarf_113fb::_create_threaded_window
            ((WindowHandle)local_30,(string *)this,(int)_y_local,w_local,h_local,handle._4_4_);
  std::unique_ptr<std::thread,_std::default_delete<std::thread>_>::operator=
            ((unique_ptr<std::thread,_std::default_delete<std::thread>_> *)(local_30._8_8_ + 0x50),
             (unique_ptr<std::thread,_std::default_delete<std::thread>_> *)local_30);
  std::unique_ptr<std::thread,_std::default_delete<std::thread>_>::~unique_ptr
            ((unique_ptr<std::thread,_std::default_delete<std::thread>_> *)local_30);
  return (WindowHandle)local_30._8_8_;
}

Assistant:

WindowHandle create_window(const std::string& title, int x, int y, int w, int h)
  {
#ifdef _WIN32
  WindowHandle handle = new WindowHandleData();
  handle->h_wnd = nullptr;
  handle->bytes = nullptr;
#else
  if (!XThreads_initialized)
    {
    XInitThreads(); // This should be called exactly once at the beginning of an XLib multithreaded application.
    XThreads_initialized = true;
    }
  WindowHandle handle = new WindowHandleData();
  handle->display = nullptr;
  handle->im = nullptr;
  handle->pix_w = 0;
  handle->pix_h = 0;
  handle->data = nullptr;
  handle->bytes = nullptr;
#endif
  handle->listener = nullptr;
  handle->w = 0;
  handle->h = 0;
  handle->x = x;
  handle->y = y;
  handle->channels = 0;
#ifdef _WIN32
  handle->t = _create_threaded_window(&(handle->h_wnd), handle, title, x, y, w, h);
#else
  handle->t = _create_threaded_window(handle, title, x, y, w, h);
#endif
  return handle;
  }